

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
          *samples,bool logBucketPerformance)

{
  int iVar1;
  UploadSampleAnalyzeResult UVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  string *description;
  TestLog *pTVar6;
  const_reference pvVar7;
  offset_in_SampleType_to_deUint64 in_RCX;
  int numBytes;
  undefined1 auVar8 [12];
  pointer *local_1a98;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
  *local_18c8;
  allocator<char> local_1889;
  string local_1888;
  allocator<char> local_1861;
  string local_1860;
  allocator<char> local_1839;
  string local_1838;
  LogNumber<float> local_1818;
  allocator<char> local_17a9;
  string local_17a8;
  allocator<char> local_1781;
  string local_1780;
  allocator<char> local_1759;
  string local_1758;
  LogNumber<float> local_1738;
  allocator<char> local_16c9;
  string local_16c8;
  allocator<char> local_16a1;
  string local_16a0;
  allocator<char> local_1679;
  string local_1678;
  LogNumber<float> local_1658;
  allocator<char> local_15e9;
  string local_15e8;
  allocator<char> local_15c1;
  string local_15c0;
  allocator<char> local_1599;
  string local_1598;
  LogNumber<float> local_1578;
  allocator<char> local_1509;
  string local_1508;
  allocator<char> local_14e1;
  string local_14e0;
  allocator<char> local_14b9;
  string local_14b8;
  LogNumber<float> local_1498;
  allocator<char> local_1429;
  string local_1428;
  allocator<char> local_1401;
  string local_1400;
  allocator<char> local_13d9;
  string local_13d8;
  LogNumber<float> local_13b8;
  allocator<char> local_1349;
  string local_1348;
  allocator<char> local_1321;
  string local_1320;
  allocator<char> local_12f9;
  string local_12f8;
  LogNumber<float> local_12d8;
  allocator<char> local_1269;
  string local_1268;
  allocator<char> local_1241;
  string local_1240;
  allocator<char> local_1219;
  string local_1218;
  LogNumber<float> local_11f8;
  allocator<char> local_1189;
  string local_1188;
  allocator<char> local_1161;
  string local_1160;
  allocator<char> local_1139;
  string local_1138;
  LogNumber<float> local_1118;
  allocator<char> local_10a9;
  string local_10a8;
  allocator<char> local_1081;
  string local_1080;
  allocator<char> local_1059;
  string local_1058;
  LogNumber<float> local_1038;
  allocator<char> local_fc9;
  string local_fc8;
  allocator<char> local_fa1;
  string local_fa0;
  allocator<char> local_f79;
  string local_f78;
  LogNumber<float> local_f58;
  allocator<char> local_ee9;
  string local_ee8;
  allocator<char> local_ec1;
  string local_ec0;
  allocator<char> local_e99;
  string local_e98;
  LogNumber<float> local_e78;
  float local_e10;
  float local_e0c;
  float sampleTemporalStability;
  float sampleLinearity;
  float approximatedTransferTimeNoConstant;
  float approximatedTransferTime;
  int medianBufferSize;
  allocator<char> local_dd1;
  string local_dd0;
  ScopedLogSection local_db0;
  ScopedLogSection section_3;
  string local_da0;
  allocator<char> local_d79;
  string local_d78;
  ScopedLogSection local_d58;
  ScopedLogSection section_2;
  string local_d48;
  allocator<char> local_d21;
  string local_d20;
  allocator<char> local_cf9;
  string local_cf8;
  LogNumber<float> local_cd8;
  allocator<char> local_c69;
  string local_c68;
  allocator<char> local_c41;
  string local_c40;
  allocator<char> local_c19;
  string local_c18;
  LogNumber<float> local_bf8;
  allocator<char> local_b89;
  string local_b88;
  allocator<char> local_b61;
  string local_b60;
  allocator<char> local_b39;
  string local_b38;
  LogNumber<float> local_b18;
  allocator<char> local_aa9;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  allocator<char> local_a59;
  string local_a58;
  LogNumber<float> local_a38;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  LogNumber<float> local_958;
  allocator<char> local_8e9;
  string local_8e8;
  allocator<char> local_8c1;
  string local_8c0;
  allocator<char> local_899;
  string local_898;
  LogNumber<float> local_878;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  LogNumber<float> local_798;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  LogNumber<float> local_6b8;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  LogNumber<float> local_5d8;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  LogNumber<float> local_4f8;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  LogNumber<float> local_418;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  LogNumber<float> local_338;
  string local_2d0;
  string local_2b0;
  allocator<char> local_289;
  string local_288 [39];
  allocator<char> local_261;
  string local_260;
  ScopedLogSection local_240;
  ScopedLogSection section_1;
  StatsType stats;
  int bucketRangeMax;
  int bucketRangeMin;
  int bucketNdx;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
  buckets [4];
  int local_140;
  int local_13c;
  int maxBufferSize;
  int minBufferSize;
  int numBuckets;
  allocator<char> local_f9;
  string local_f8;
  ScopedLogSection local_d8;
  ScopedLogSection section;
  float approximatedTransferRateNoConstant;
  float approximatedTransferRate;
  StatsType resultStats;
  LineParametersWithConfidence theilSenFitting;
  bool logBucketPerformance_local;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
  *samples_local;
  TestLog *log_local;
  UploadSampleAnalyzeResult result;
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            ((LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,
             (_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x20,in_RCX);
  calculateSampleStatistics
            ((MapCallStatistics *)&approximatedTransferRateNoConstant,
             (LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Samples",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numBuckets,"Samples",(allocator<char> *)((long)&minBufferSize + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_d8,log,&local_f8,(string *)&numBuckets);
  std::__cxx11::string::~string((string *)&numBuckets);
  std::allocator<char>::~allocator((allocator<char> *)((long)&minBufferSize + 3));
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  logSampleList(log,(LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  tcu::ScopedLogSection::~ScopedLogSection(&local_d8);
  if (logBucketPerformance) {
    maxBufferSize = 4;
    local_13c = 0;
    local_140 = 0;
    local_18c8 = (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                  *)&bucketRangeMin;
    do {
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
      ::vector(local_18c8);
      local_18c8 = local_18c8 + 1;
    } while (local_18c8 !=
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)&buckets[3].
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bucketizeSamplesUniformly<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
              (samples,(vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                        *)&bucketRangeMin,4,&local_13c,&local_140);
    for (bucketRangeMax = 0; bucketRangeMax < 4; bucketRangeMax = bucketRangeMax + 1) {
      bVar3 = std::
              vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              ::empty((vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                       *)(&bucketRangeMin + (long)bucketRangeMax * 6));
      if (!bVar3) {
        uVar4 = local_13c + (int)((float)bucketRangeMax * 0.25 * (float)(local_140 - local_13c));
        uVar5 = local_13c +
                (int)((float)(bucketRangeMax + 1) * 0.25 * (float)(local_140 - local_13c));
        calculateSampleStatistics
                  ((MapCallStatistics *)((long)&section_1.m_log + 4),
                   (LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,
                   (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    *)(&bucketRangeMin + (long)bucketRangeMax * 6));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"BufferSizeRange",&local_261);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_288,"Transfer performance with buffer size in range [",&local_289);
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_2b0,(_anonymous_namespace_ *)(ulong)uVar4,numBytes);
        auVar8 = std::__cxx11::string::append((char *)&local_2b0);
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_2d0,(_anonymous_namespace_ *)(ulong)uVar5,auVar8._8_4_);
        std::__cxx11::string::append((char *)&local_2d0);
        std::__cxx11::string::append(auVar8._0_8_);
        description = (string *)std::__cxx11::string::append(local_288);
        tcu::ScopedLogSection::ScopedLogSection(&local_240,log,&local_260,description);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string(local_288);
        std::allocator<char>::~allocator(&local_289);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator(&local_261);
        logMapRangeStats<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                  (log,(StatsType *)((long)&section_1.m_log + 4));
        logUnmapStats<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                  (log,(StatsType *)((long)&section_1.m_log + 4));
        logWriteStats<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                  (log,(StatsType *)((long)&section_1.m_log + 4));
        logFlushStats<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                  (log,(StatsType *)((long)&section_1.m_log + 4));
        logAllocStats<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                  (log,(StatsType *)((long)&section_1.m_log + 4));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"Min",&local_359);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_380,"Total: Min time",&local_381);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"us",&local_3a9);
        tcu::LogNumber<float>::LogNumber
                  (&local_338,&local_358,&local_380,&local_3a8,QP_KEY_TAG_TIME,
                   stats.alloc.min2DecileTime);
        pTVar6 = tcu::TestLog::operator<<(log,&local_338);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"Max",&local_439);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_460,"Total: Max time",&local_461);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"us",&local_489);
        tcu::LogNumber<float>::LogNumber
                  (&local_418,&local_438,&local_460,&local_488,QP_KEY_TAG_TIME,
                   stats.alloc.max9DecileTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_418);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"Min90",&local_519);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_540,"Total: 90%-Min time",&local_541);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"us",&local_569);
        tcu::LogNumber<float>::LogNumber
                  (&local_4f8,&local_518,&local_540,&local_568,QP_KEY_TAG_TIME,stats.result.maxTime)
        ;
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_4f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"Max90",&local_5f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_620,"Total: 90%-Max time",&local_621);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"us",&local_649);
        tcu::LogNumber<float>::LogNumber
                  (&local_5d8,&local_5f8,&local_620,&local_648,QP_KEY_TAG_TIME,
                   stats.result.medianTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_5d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"Median",&local_6d9)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_700,"Total: Median time",&local_701);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"us",&local_729);
        tcu::LogNumber<float>::LogNumber
                  (&local_6b8,&local_6d8,&local_700,&local_728,QP_KEY_TAG_TIME,stats.result.minTime)
        ;
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_6b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b8,"MedianTransfer",&local_7b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e0,"Median transfer rate",&local_7e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"MB / s",&local_809)
        ;
        tcu::LogNumber<float>::LogNumber
                  (&local_798,&local_7b8,&local_7e0,&local_808,QP_KEY_TAG_PERFORMANCE,
                   stats.result.min2DecileTime * 0.0009765625 * 0.0009765625);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_798);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_898,"MaxDiff",&local_899);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c0,"Max difference to approximated",&local_8c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"us",&local_8e9);
        tcu::LogNumber<float>::LogNumber
                  (&local_878,&local_898,&local_8c0,&local_8e8,QP_KEY_TAG_TIME,
                   stats.result.max9DecileTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_878);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_978,"Max90Diff",&local_979);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9a0,"90%-Max difference to approximated",&local_9a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"us",&local_9c9);
        tcu::LogNumber<float>::LogNumber
                  (&local_958,&local_978,&local_9a0,&local_9c8,QP_KEY_TAG_TIME,stats.medianRate);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_958);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a58,"MedianDiff",&local_a59);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a80,"Median difference to approximated",&local_a81);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa8,"us",&local_aa9);
        tcu::LogNumber<float>::LogNumber
                  (&local_a38,&local_a58,&local_a80,&local_aa8,QP_KEY_TAG_TIME,stats.maxDiffTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_a38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b38,"MaxRelDiff",&local_b39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b60,"Max relative difference to approximated",&local_b61);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b88,"%",&local_b89);
        tcu::LogNumber<float>::LogNumber
                  (&local_b18,&local_b38,&local_b60,&local_b88,QP_KEY_TAG_NONE,
                   stats.maxDiff9DecileTime * 100.0);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_b18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c18,"Max90RelDiff",&local_c19);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c40,"90%-Max relative difference to approximated",&local_c41);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c68,"%",&local_c69);
        tcu::LogNumber<float>::LogNumber
                  (&local_bf8,&local_c18,&local_c40,&local_c68,QP_KEY_TAG_NONE,
                   stats.medianDiffTime * 100.0);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_bf8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_cf8,"MedianRelDiff",&local_cf9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d20,"Median relative difference to approximated",&local_d21);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d48,"%",(allocator<char> *)((long)&section_2.m_log + 7));
        tcu::LogNumber<float>::LogNumber
                  (&local_cd8,&local_cf8,&local_d20,&local_d48,QP_KEY_TAG_NONE,
                   stats.maxRelDiffTime * 100.0);
        tcu::TestLog::operator<<(pTVar6,&local_cd8);
        tcu::LogNumber<float>::~LogNumber(&local_cd8);
        std::__cxx11::string::~string((string *)&local_d48);
        std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
        std::__cxx11::string::~string((string *)&local_d20);
        std::allocator<char>::~allocator(&local_d21);
        std::__cxx11::string::~string((string *)&local_cf8);
        std::allocator<char>::~allocator(&local_cf9);
        tcu::LogNumber<float>::~LogNumber(&local_bf8);
        std::__cxx11::string::~string((string *)&local_c68);
        std::allocator<char>::~allocator(&local_c69);
        std::__cxx11::string::~string((string *)&local_c40);
        std::allocator<char>::~allocator(&local_c41);
        std::__cxx11::string::~string((string *)&local_c18);
        std::allocator<char>::~allocator(&local_c19);
        tcu::LogNumber<float>::~LogNumber(&local_b18);
        std::__cxx11::string::~string((string *)&local_b88);
        std::allocator<char>::~allocator(&local_b89);
        std::__cxx11::string::~string((string *)&local_b60);
        std::allocator<char>::~allocator(&local_b61);
        std::__cxx11::string::~string((string *)&local_b38);
        std::allocator<char>::~allocator(&local_b39);
        tcu::LogNumber<float>::~LogNumber(&local_a38);
        std::__cxx11::string::~string((string *)&local_aa8);
        std::allocator<char>::~allocator(&local_aa9);
        std::__cxx11::string::~string((string *)&local_a80);
        std::allocator<char>::~allocator(&local_a81);
        std::__cxx11::string::~string((string *)&local_a58);
        std::allocator<char>::~allocator(&local_a59);
        tcu::LogNumber<float>::~LogNumber(&local_958);
        std::__cxx11::string::~string((string *)&local_9c8);
        std::allocator<char>::~allocator(&local_9c9);
        std::__cxx11::string::~string((string *)&local_9a0);
        std::allocator<char>::~allocator(&local_9a1);
        std::__cxx11::string::~string((string *)&local_978);
        std::allocator<char>::~allocator(&local_979);
        tcu::LogNumber<float>::~LogNumber(&local_878);
        std::__cxx11::string::~string((string *)&local_8e8);
        std::allocator<char>::~allocator(&local_8e9);
        std::__cxx11::string::~string((string *)&local_8c0);
        std::allocator<char>::~allocator(&local_8c1);
        std::__cxx11::string::~string((string *)&local_898);
        std::allocator<char>::~allocator(&local_899);
        tcu::LogNumber<float>::~LogNumber(&local_798);
        std::__cxx11::string::~string((string *)&local_808);
        std::allocator<char>::~allocator(&local_809);
        std::__cxx11::string::~string((string *)&local_7e0);
        std::allocator<char>::~allocator(&local_7e1);
        std::__cxx11::string::~string((string *)&local_7b8);
        std::allocator<char>::~allocator(&local_7b9);
        tcu::LogNumber<float>::~LogNumber(&local_6b8);
        std::__cxx11::string::~string((string *)&local_728);
        std::allocator<char>::~allocator(&local_729);
        std::__cxx11::string::~string((string *)&local_700);
        std::allocator<char>::~allocator(&local_701);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::allocator<char>::~allocator(&local_6d9);
        tcu::LogNumber<float>::~LogNumber(&local_5d8);
        std::__cxx11::string::~string((string *)&local_648);
        std::allocator<char>::~allocator(&local_649);
        std::__cxx11::string::~string((string *)&local_620);
        std::allocator<char>::~allocator(&local_621);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::allocator<char>::~allocator(&local_5f9);
        tcu::LogNumber<float>::~LogNumber(&local_4f8);
        std::__cxx11::string::~string((string *)&local_568);
        std::allocator<char>::~allocator(&local_569);
        std::__cxx11::string::~string((string *)&local_540);
        std::allocator<char>::~allocator(&local_541);
        std::__cxx11::string::~string((string *)&local_518);
        std::allocator<char>::~allocator(&local_519);
        tcu::LogNumber<float>::~LogNumber(&local_418);
        std::__cxx11::string::~string((string *)&local_488);
        std::allocator<char>::~allocator(&local_489);
        std::__cxx11::string::~string((string *)&local_460);
        std::allocator<char>::~allocator(&local_461);
        std::__cxx11::string::~string((string *)&local_438);
        std::allocator<char>::~allocator(&local_439);
        tcu::LogNumber<float>::~LogNumber(&local_338);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator(&local_3a9);
        std::__cxx11::string::~string((string *)&local_380);
        std::allocator<char>::~allocator(&local_381);
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator(&local_359);
        tcu::ScopedLogSection::~ScopedLogSection(&local_240);
      }
    }
    local_1a98 = &buckets[3].
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_1a98 = local_1a98 + -3;
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
      ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                 *)local_1a98);
    } while (local_1a98 != (pointer *)&bucketRangeMin);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d78,"Contribution",&local_d79)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_da0,"Contributions",(allocator<char> *)((long)&section_3.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_d58,log,&local_d78,&local_da0);
  std::__cxx11::string::~string((string *)&local_da0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_3.m_log + 7));
  std::__cxx11::string::~string((string *)&local_d78);
  std::allocator<char>::~allocator(&local_d79);
  logMapContribution<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            (log,samples,(StatsType *)&approximatedTransferRateNoConstant);
  logUnmapContribution<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            (log,samples,(StatsType *)&approximatedTransferRateNoConstant);
  logWriteContribution<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            (log,samples,(StatsType *)&approximatedTransferRateNoConstant);
  logFlushContribution<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            (log,samples,(StatsType *)&approximatedTransferRateNoConstant);
  logAllocContribution<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            (log,samples,(StatsType *)&approximatedTransferRateNoConstant);
  tcu::ScopedLogSection::~ScopedLogSection(&local_d58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd0,"Results",&local_dd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&medianBufferSize,"Results",
             (allocator<char> *)((long)&approximatedTransferTime + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_db0,log,&local_dd0,(string *)&medianBufferSize);
  std::__cxx11::string::~string((string *)&medianBufferSize);
  std::allocator<char>::~allocator((allocator<char> *)((long)&approximatedTransferTime + 3));
  std::__cxx11::string::~string((string *)&local_dd0);
  std::allocator<char>::~allocator(&local_dd1);
  pvVar7 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           ::front(samples);
  iVar1 = pvVar7->bufferSize;
  pvVar7 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           ::back(samples);
  approximatedTransferTimeNoConstant = (float)((iVar1 + pvVar7->bufferSize) / 2);
  sampleLinearity =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedTransferTimeNoConstant +
        resultStats.max9DecileRelDiffTime) / 1000.0) / 1000.0;
  sampleTemporalStability =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedTransferTimeNoConstant) /
       1000.0) / 1000.0;
  local_e0c = calculateSampleFitLinearity<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                        (samples);
  local_e10 = calculateSampleTemporalStability<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
                        (samples);
  section.m_log._0_4_ = (float)(int)approximatedTransferTimeNoConstant / sampleTemporalStability;
  section.m_log._4_4_ = (float)(int)approximatedTransferTimeNoConstant / sampleLinearity;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e98,"ResultLinearity",&local_e99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ec0,"Sample linearity",&local_ec1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ee8,"%",&local_ee9);
  tcu::LogNumber<float>::LogNumber
            (&local_e78,&local_e98,&local_ec0,&local_ee8,QP_KEY_TAG_QUALITY,local_e0c * 100.0);
  pTVar6 = tcu::TestLog::operator<<(log,&local_e78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f78,"SampleTemporalStability",&local_f79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa0,"Sample temporal stability",&local_fa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fc8,"%",&local_fc9);
  tcu::LogNumber<float>::LogNumber
            (&local_f58,&local_f78,&local_fa0,&local_fc8,QP_KEY_TAG_QUALITY,local_e10 * 100.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_f58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1058,"ApproximatedConstantCost",&local_1059);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1080,"Approximated contant cost",&local_1081);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10a8,"us",&local_10a9);
  tcu::LogNumber<float>::LogNumber
            (&local_1038,&local_1058,&local_1080,&local_10a8,QP_KEY_TAG_TIME,
             resultStats.max9DecileRelDiffTime);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1038);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1138,"ApproximatedConstantCostConfidence60Lower",&local_1139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1160,"Approximated contant cost 60% confidence lower limit",
             &local_1161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1188,"us",&local_1189);
  tcu::LogNumber<float>::LogNumber
            (&local_1118,&local_1138,&local_1160,&local_1188,QP_KEY_TAG_TIME,theilSenFitting.offset)
  ;
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1218,"ApproximatedConstantCostConfidence60Upper",&local_1219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1240,"Approximated contant cost 60% confidence upper limit",
             &local_1241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1268,"us",&local_1269);
  tcu::LogNumber<float>::LogNumber
            (&local_11f8,&local_1218,&local_1240,&local_1268,QP_KEY_TAG_TIME,
             resultStats.medianRelDiffTime);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_11f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12f8,"ApproximatedLinearCost",&local_12f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1320,"Approximated linear cost",&local_1321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1348,"us / MB",&local_1349);
  tcu::LogNumber<float>::LogNumber
            (&local_12d8,&local_12f8,&local_1320,&local_1348,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper * 1024.0 * 1024.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_12d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13d8,"ApproximatedLinearCostConfidence60Lower",&local_13d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1400,"Approximated linear cost 60% confidence lower limit",&local_1401
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1428,"us / MB",&local_1429);
  tcu::LogNumber<float>::LogNumber
            (&local_13b8,&local_13d8,&local_1400,&local_1428,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_13b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14b8,"ApproximatedLinearCostConfidence60Upper",&local_14b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14e0,"Approximated linear cost 60% confidence upper limit",&local_14e1
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1508,"us / MB",&local_1509);
  tcu::LogNumber<float>::LogNumber
            (&local_1498,&local_14b8,&local_14e0,&local_1508,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower * 1024.0 * 1024.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1498);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1598,"ApproximatedTransferRate",&local_1599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15c0,"Approximated transfer rate",&local_15c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_15e8,"MB / s",&local_15e9);
  tcu::LogNumber<float>::LogNumber
            (&local_1578,&local_1598,&local_15c0,&local_15e8,QP_KEY_TAG_PERFORMANCE,
             section.m_log._4_4_ * 0.0009765625 * 0.0009765625);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1678,"ApproximatedTransferRateNoConstant",&local_1679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16a0,"Approximated transfer rate without constant cost",&local_16a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_16c8,"MB / s",&local_16c9);
  tcu::LogNumber<float>::LogNumber
            (&local_1658,&local_1678,&local_16a0,&local_16c8,QP_KEY_TAG_PERFORMANCE,
             section.m_log._0_4_ * 0.0009765625 * 0.0009765625);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1658);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1758,"SampleMedianTime",&local_1759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1780,"Median sample time",&local_1781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_17a8,"us",&local_17a9);
  tcu::LogNumber<float>::LogNumber
            (&local_1738,&local_1758,&local_1780,&local_17a8,QP_KEY_TAG_TIME,
             resultStats.result.minTime);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1838,"SampleMedianTransfer",&local_1839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1860,"Median transfer rate",&local_1861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1888,"MB / s",&local_1889);
  tcu::LogNumber<float>::LogNumber
            (&local_1818,&local_1838,&local_1860,&local_1888,QP_KEY_TAG_PERFORMANCE,
             resultStats.result.min2DecileTime * 0.0009765625 * 0.0009765625);
  tcu::TestLog::operator<<(pTVar6,&local_1818);
  tcu::LogNumber<float>::~LogNumber(&local_1818);
  std::__cxx11::string::~string((string *)&local_1888);
  std::allocator<char>::~allocator(&local_1889);
  std::__cxx11::string::~string((string *)&local_1860);
  std::allocator<char>::~allocator(&local_1861);
  std::__cxx11::string::~string((string *)&local_1838);
  std::allocator<char>::~allocator(&local_1839);
  tcu::LogNumber<float>::~LogNumber(&local_1738);
  std::__cxx11::string::~string((string *)&local_17a8);
  std::allocator<char>::~allocator(&local_17a9);
  std::__cxx11::string::~string((string *)&local_1780);
  std::allocator<char>::~allocator(&local_1781);
  std::__cxx11::string::~string((string *)&local_1758);
  std::allocator<char>::~allocator(&local_1759);
  tcu::LogNumber<float>::~LogNumber(&local_1658);
  std::__cxx11::string::~string((string *)&local_16c8);
  std::allocator<char>::~allocator(&local_16c9);
  std::__cxx11::string::~string((string *)&local_16a0);
  std::allocator<char>::~allocator(&local_16a1);
  std::__cxx11::string::~string((string *)&local_1678);
  std::allocator<char>::~allocator(&local_1679);
  tcu::LogNumber<float>::~LogNumber(&local_1578);
  std::__cxx11::string::~string((string *)&local_15e8);
  std::allocator<char>::~allocator(&local_15e9);
  std::__cxx11::string::~string((string *)&local_15c0);
  std::allocator<char>::~allocator(&local_15c1);
  std::__cxx11::string::~string((string *)&local_1598);
  std::allocator<char>::~allocator(&local_1599);
  tcu::LogNumber<float>::~LogNumber(&local_1498);
  std::__cxx11::string::~string((string *)&local_1508);
  std::allocator<char>::~allocator(&local_1509);
  std::__cxx11::string::~string((string *)&local_14e0);
  std::allocator<char>::~allocator(&local_14e1);
  std::__cxx11::string::~string((string *)&local_14b8);
  std::allocator<char>::~allocator(&local_14b9);
  tcu::LogNumber<float>::~LogNumber(&local_13b8);
  std::__cxx11::string::~string((string *)&local_1428);
  std::allocator<char>::~allocator(&local_1429);
  std::__cxx11::string::~string((string *)&local_1400);
  std::allocator<char>::~allocator(&local_1401);
  std::__cxx11::string::~string((string *)&local_13d8);
  std::allocator<char>::~allocator(&local_13d9);
  tcu::LogNumber<float>::~LogNumber(&local_12d8);
  std::__cxx11::string::~string((string *)&local_1348);
  std::allocator<char>::~allocator(&local_1349);
  std::__cxx11::string::~string((string *)&local_1320);
  std::allocator<char>::~allocator(&local_1321);
  std::__cxx11::string::~string((string *)&local_12f8);
  std::allocator<char>::~allocator(&local_12f9);
  tcu::LogNumber<float>::~LogNumber(&local_11f8);
  std::__cxx11::string::~string((string *)&local_1268);
  std::allocator<char>::~allocator(&local_1269);
  std::__cxx11::string::~string((string *)&local_1240);
  std::allocator<char>::~allocator(&local_1241);
  std::__cxx11::string::~string((string *)&local_1218);
  std::allocator<char>::~allocator(&local_1219);
  tcu::LogNumber<float>::~LogNumber(&local_1118);
  std::__cxx11::string::~string((string *)&local_1188);
  std::allocator<char>::~allocator(&local_1189);
  std::__cxx11::string::~string((string *)&local_1160);
  std::allocator<char>::~allocator(&local_1161);
  std::__cxx11::string::~string((string *)&local_1138);
  std::allocator<char>::~allocator(&local_1139);
  tcu::LogNumber<float>::~LogNumber(&local_1038);
  std::__cxx11::string::~string((string *)&local_10a8);
  std::allocator<char>::~allocator(&local_10a9);
  std::__cxx11::string::~string((string *)&local_1080);
  std::allocator<char>::~allocator(&local_1081);
  std::__cxx11::string::~string((string *)&local_1058);
  std::allocator<char>::~allocator(&local_1059);
  tcu::LogNumber<float>::~LogNumber(&local_f58);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::allocator<char>::~allocator(&local_fc9);
  std::__cxx11::string::~string((string *)&local_fa0);
  std::allocator<char>::~allocator(&local_fa1);
  std::__cxx11::string::~string((string *)&local_f78);
  std::allocator<char>::~allocator(&local_f79);
  tcu::LogNumber<float>::~LogNumber(&local_e78);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::allocator<char>::~allocator(&local_ee9);
  std::__cxx11::string::~string((string *)&local_ec0);
  std::allocator<char>::~allocator(&local_ec1);
  std::__cxx11::string::~string((string *)&local_e98);
  std::allocator<char>::~allocator(&local_e99);
  tcu::ScopedLogSection::~ScopedLogSection(&local_db0);
  UVar2.transferRateAtRange = section.m_log._4_4_;
  UVar2.transferRateMedian = resultStats.result.min2DecileTime;
  UVar2.transferRateAtInfinity = section.m_log._0_4_;
  return UVar2;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}